

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.cpp
# Opt level: O2

void formatJSON(string *filename,int indent)

{
  clock_t cVar1;
  clock_t cVar2;
  ostream *poVar3;
  Stringifier stringifier;
  string str;
  Parser parser;
  Stringifier local_130;
  string local_128;
  Parser local_108;
  
  cVar1 = clock();
  JSON::resolvePath((string *)&local_108,filename);
  std::__cxx11::string::operator=((string *)filename,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  JSON::readFile(&local_128,filename);
  JSON::Parser::Parser(&local_108,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  local_130.configIndent = 0;
  local_130.current = 0;
  JSON::Parser::parse(&local_108);
  JSON::Stringifier::stringify_abi_cxx11_(&local_128,&local_130,&local_108.ast,indent);
  JSON::writeFile(filename,&local_128);
  std::operator<<((ostream *)&std::cout,"Complete! Cost: ");
  cVar2 = clock();
  poVar3 = std::ostream::_M_insert<double>((double)(cVar2 - cVar1) / 1000000.0);
  poVar3 = std::operator<<(poVar3,"s");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_128);
  JSON::Parser::~Parser(&local_108);
  return;
}

Assistant:

void formatJSON(string filename, int indent) {
    clock_t start = clock();
    filename = JSON::resolvePath(filename);
    JSON::Parser parser(JSON::readFile(filename));
    JSON::Stringifier stringifier;
    parser.parse();
    string str = stringifier.stringify(parser.ast, indent);
    JSON::writeFile(filename, str);
    cout << "Complete! Cost: " << (double) (clock() - start) / CLOCKS_PER_SEC << "s" << endl;
}